

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O2

char * __thiscall cppcms::impl::string_map::get(string_map *this,char *ckey)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  pointer peVar4;
  int iVar5;
  ulong uVar6;
  entry e;
  
  e.value = "";
  e.key = ckey;
  e.hash = entry::calc_hash(ckey);
  e.next_index = 0;
  uVar6 = (ulong)e.hash;
  peVar4 = (this->data_).
           super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = ((long)(this->data_).
                          super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)peVar4) / 0x18;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    iVar5 = SUB164(auVar2 % auVar1,0);
    if (peVar4[iVar5].key == (char *)0x0) {
      return (char *)0x0;
    }
    bVar3 = entry::operator==(peVar4 + iVar5,&e);
    peVar4 = (this->data_).
             super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (bVar3) break;
    uVar6 = (SUB168(auVar2 % auVar1,0) << 0x20) + 0x100000000 >> 0x20;
  }
  if (peVar4[iVar5].key != (char *)0x0) {
    return peVar4[iVar5].value;
  }
  return (char *)0x0;
}

Assistant:

char const *get(char const *ckey)
			{
				entry e(ckey);
				int pos = e.hash % data_.size();
				while(data_[pos].key && !(data_[pos] == e)) 
					pos = (pos + 1) % data_.size();
				if(data_[pos].key == 0)
					return 0;
				return data_[pos].value;
			}